

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printAddrMode3OffsetOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  char *pcVar4;
  uint uVar5;
  MCOperand *op;
  MCOperand *op_00;
  ulong uVar6;
  ulong uVar7;
  cs_insn **ppcVar8;
  int iVar9;
  char *pcVar10;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  uVar6 = MCOperand_getImm(op_00);
  uVar5 = MCOperand_getReg(op);
  if (uVar5 == 0) {
    uVar7 = MCOperand_getImm(op_00);
    pcVar10 = "-";
    if ((uVar6 & 0x100) == 0) {
      pcVar10 = anon_var_dwarf_e9efb + 0x11;
    }
    pcVar4 = ", #%s%u";
    if (9 < (byte)uVar7) {
      pcVar4 = ", #%s0x%x";
    }
    iVar9 = (int)(uVar7 & 0xff);
    SStream_concat(O,pcVar4 + 2,pcVar10,uVar7 & 0xff);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    ppcVar8 = &MI->flat_insn;
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    if ((uVar6 & 0x100) == 0) {
      *(int *)((*ppcVar8)->detail->groups +
              (ulong)((*ppcVar8)->detail->field_6).arm.op_count * 0x28 + 0x46) = iVar9;
      (*ppcVar8)->detail->groups[(ulong)((*ppcVar8)->detail->field_6).arm.op_count * 0x28 + 0x56] =
           '\x01';
    }
    else {
      *(int *)((*ppcVar8)->detail->groups +
              (ulong)((*ppcVar8)->detail->field_6).arm.op_count * 0x28 + 0x46) = -iVar9;
    }
  }
  else {
    pcVar10 = "-";
    if ((uVar6 & 0x100) == 0) {
      pcVar10 = anon_var_dwarf_e9efb + 0x11;
    }
    SStream_concat0(O,pcVar10);
    pcVar2 = MI->csh;
    uVar5 = MCOperand_getReg(op);
    pcVar10 = (*pcVar2->get_regname)(uVar5);
    SStream_concat0(O,pcVar10);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar5 = MCOperand_getReg(op);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar5;
    pcVar3 = MI->flat_insn->detail;
    pcVar3->groups[(ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x56] = (byte)(uVar6 >> 8) & 1;
  }
  puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
  *puVar1 = *puVar1 + '\x01';
  return;
}

Assistant:

static void printAddrMode3OffsetOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	ARM_AM_AddrOpc subtracted = getAM3Op((unsigned int)MCOperand_getImm(MO2));
	unsigned ImmOffs;

	if (MCOperand_getReg(MO1)) {
		SStream_concat0(O, ARM_AM_getAddrOpcStr(subtracted));
		printRegName(MI->csh, O, MCOperand_getReg(MO1));
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = subtracted == ARM_AM_sub;
			MI->flat_insn->detail->arm.op_count++;
		}
		return;
	}

	ImmOffs = getAM3Offset((unsigned int)MCOperand_getImm(MO2));
	if (ImmOffs > HEX_THRESHOLD)
		SStream_concat(O, "#%s0x%x", ARM_AM_getAddrOpcStr(subtracted), ImmOffs);
	else
		SStream_concat(O, "#%s%u", ARM_AM_getAddrOpcStr(subtracted), ImmOffs);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;

		if (subtracted) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = ImmOffs;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = true;
		} else
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = -(int)ImmOffs;

		MI->flat_insn->detail->arm.op_count++;
	}
}